

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_emit_block_sequence_item(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  yaml_emitter_state_t *pyVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint indentless;
  
  if (first != 0) {
    indentless = 0;
    if (emitter->mapping_context != 0) {
      indentless = (uint)(emitter->indention == 0);
    }
    iVar3 = yaml_emitter_increase_indent(emitter,0,indentless);
    if (iVar3 == 0) {
      return 0;
    }
  }
  if (event->type == YAML_SEQUENCE_END_EVENT) {
    pyVar1 = (emitter->states).top;
    piVar2 = (emitter->indents).top;
    (emitter->indents).top = piVar2 + -1;
    emitter->indent = piVar2[-1];
    (emitter->states).top = pyVar1 + -1;
    emitter->state = pyVar1[-1];
    iVar3 = 1;
  }
  else {
    iVar3 = yaml_emitter_write_indent(emitter);
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      iVar4 = yaml_emitter_write_indicator(emitter,"-",1,0,1);
      if (iVar4 != 0) {
        if (((emitter->states).top == (emitter->states).end) &&
           (iVar3 = yaml_stack_extend(&(emitter->states).start,&(emitter->states).top,
                                      &(emitter->states).end), iVar3 == 0)) {
          emitter->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar1 = (emitter->states).top;
        (emitter->states).top = pyVar1 + 1;
        *pyVar1 = YAML_EMIT_BLOCK_SEQUENCE_ITEM_STATE;
        iVar3 = yaml_emitter_emit_node(emitter,event,0,1,0,0);
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
yaml_emitter_emit_block_sequence_item(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (first)
    {
        if (!yaml_emitter_increase_indent(emitter, 0,
                    (emitter->mapping_context && !emitter->indention)))
            return 0;
    }

    if (event->type == YAML_SEQUENCE_END_EVENT)
    {
        emitter->indent = POP(emitter, emitter->indents);
        emitter->state = POP(emitter, emitter->states);

        return 1;
    }

    if (!yaml_emitter_write_indent(emitter))
        return 0;
    if (!yaml_emitter_write_indicator(emitter, "-", 1, 0, 1))
        return 0;
    if (!PUSH(emitter, emitter->states,
                YAML_EMIT_BLOCK_SEQUENCE_ITEM_STATE))
        return 0;

    return yaml_emitter_emit_node(emitter, event, 0, 1, 0, 0);
}